

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O2

void __thiscall QNetworkCookie::setSameSitePolicy(QNetworkCookie *this,SameSite sameSite)

{
  QNetworkCookiePrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkCookiePrivate>::operator->(&this->d);
  pQVar1->sameSite = sameSite;
  return;
}

Assistant:

void QNetworkCookie::setSameSitePolicy(QNetworkCookie::SameSite sameSite)
{
    d->sameSite = sameSite;
}